

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::
TestVector<CSHA256,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CSHA256 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  CSHA256 *pCVar5;
  unsigned_long len;
  long lVar6;
  CSHA256 *pCVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  byte bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  assertion_result local_1c0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  undefined1 local_108 [8];
  element_type *local_100;
  shared_count sStack_f8;
  char **local_f0;
  CSHA256 hasher;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  local_100 = (element_type *)0x0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_1c0.m_message.px = (element_type *)0xb903a9;
  hasher.s[2]._0_1_ = 0;
  hasher.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_150 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.s._24_8_ = &local_1c0;
  local_108[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start == 0x20);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&hasher,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),(size_t)&local_158,0x25);
  boost::detail::shared_count::~shared_count(&sStack_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&hash,(long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  pCVar5 = h;
  pCVar7 = &hasher;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
    pCVar5 = (CSHA256 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
    pCVar7 = (CSHA256 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
  }
  pCVar5 = CSHA256::Write(&hasher,(uchar *)(in->_M_dataplus)._M_p,in->_M_string_length);
  CSHA256::Finalize(pCVar5,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_108[0] = (class_property<bool>)std::operator==(&hash,out);
  local_100 = (element_type *)0x0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ = "hash == out";
  local_1c0.m_message.px = (element_type *)0xca536e;
  hasher.s[2]._0_1_ = 0;
  hasher.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_180 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.s._24_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&hasher,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),(size_t)&local_188,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_f8);
  for (iVar4 = 0; iVar4 != 0x20; iVar4 = iVar4 + 1) {
    pCVar5 = h;
    pCVar7 = &hasher;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
      pCVar5 = (CSHA256 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
      pCVar7 = (CSHA256 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
    }
    uVar10 = 0;
    while (lVar6 = in->_M_string_length - uVar10, uVar10 <= in->_M_string_length && lVar6 != 0) {
      len = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       (lVar6 + 1U >> 1) + 1);
      CSHA256::Write(&hasher,(uchar *)((in->_M_dataplus)._M_p + uVar10),len);
      uVar10 = len + uVar10;
      if (uVar10 != 0) {
        uVar2 = in->_M_string_length;
        if ((uVar10 <= uVar2 && uVar2 - uVar10 != 0) &&
           (uVar2 < ((long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start) * 2 + uVar10)) {
          pCVar5 = &hasher;
          pCVar7 = (CSHA256 *)local_108;
          for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
            pCVar5 = (CSHA256 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
            pCVar7 = (CSHA256 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
          }
          pCVar5 = CSHA256::Write((CSHA256 *)local_108,(uchar *)((in->_M_dataplus)._M_p + uVar10),
                                  uVar2 - uVar10);
          CSHA256::Finalize(pCVar5,hash.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          local_198 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_190 = "";
          local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x37;
          file_01.m_begin = (iterator)&local_198;
          msg_01.m_end = pvVar9;
          msg_01.m_begin = pvVar8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_1a8,msg_01);
          bVar3 = std::operator==(&hash,out);
          local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar3;
          local_1c0.m_message.px = (element_type *)0x0;
          local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1d0 = "hash == out";
          local_1c8 = "";
          local_100 = (element_type *)((ulong)local_100 & 0xffffffffffffff00);
          local_108 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
          sStack_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_f0 = &local_1d0;
          local_1e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_1d8 = "";
          pvVar8 = &DAT_00000001;
          pvVar9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1c0,(lazy_ostream *)local_108,1,0,WARN,
                     CONCAT44(iVar4,in_stack_fffffffffffffde0),(size_t)&local_1e0,0x37);
          boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
        }
      }
    }
    CSHA256::Finalize(&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_1f0;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
               msg_02);
    bVar3 = std::operator==(&hash,out);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1d0 = "hash == out";
    local_1c8 = "";
    local_100 = (element_type *)((ulong)local_100 & 0xffffffffffffff00);
    local_108 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_f0 = &local_1d0;
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_208 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,(lazy_ostream *)local_108,1,0,WARN,
               CONCAT44(iVar4,in_stack_fffffffffffffde0),(size_t)&local_210,0x3b);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}